

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

double __thiscall smf::MidiFile::getAbsoluteTickTime(MidiFile *this,double starttime)

{
  _TickTime *__base;
  size_type __nmemb;
  int *piVar1;
  void *ptr;
  _TickTime key;
  double starttime_local;
  MidiFile *this_local;
  
  key.seconds = starttime;
  if ((((this->m_timemapvalid & 1U) == 0) && (buildTimeMap(this), (this->m_timemapvalid & 1U) == 0))
     && ((this->m_timemapvalid & 1U) == 0)) {
    this_local = (MidiFile *)0xbff0000000000000;
  }
  else {
    ptr._0_4_ = 0xffffffff;
    key._0_8_ = key.seconds;
    __base = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::data(&this->m_timemap);
    __nmemb = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size(&this->m_timemap);
    piVar1 = (int *)bsearch(&ptr,__base,__nmemb,0x10,secondsearch);
    if (piVar1 == (int *)0x0) {
      this_local = (MidiFile *)linearTickInterpolationAtSecond(this,key.seconds);
    }
    else {
      this_local = (MidiFile *)(double)*piVar1;
    }
  }
  return (double)this_local;
}

Assistant:

double MidiFile::getAbsoluteTickTime(double starttime) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			if (m_timemapvalid == 0) {
				return -1.0;    // something went wrong
			}
		}
	}

	_TickTime key;
	key.tick    = -1;
	key.seconds = starttime;

	void* ptr = bsearch(&key, m_timemap.data(), m_timemap.size(),
			sizeof(_TickTime), secondsearch);

	if (ptr == NULL) {
		// The specific seconds value was not found, so do a linear
		// search for the two time values which occur before and
		// after the given time value, and do a linear interpolation of
		// the time in tick values to figure out the final time in ticks.
		return linearTickInterpolationAtSecond(starttime);
	} else {
		return ((_TickTime*)ptr)->tick;
	}

}